

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::DoLoopBodyStart::AutoRestoreLoopNumbers::~AutoRestoreLoopNumbers
          (AutoRestoreLoopNumbers *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ThreadContext *this_00;
  FunctionBody *fn;
  AutoRestoreLoopNumbers *this_local;
  
  *(undefined4 *)(this->interpreterStackFrame + 0xcc) = 0xffffffff;
  *(undefined4 *)(this->interpreterStackFrame + 0xd0) = 0;
  bVar2 = FunctionBody::RecentlyBailedOutOfJittedLoopBody
                    (*(FunctionBody **)(this->interpreterStackFrame + 0x88));
  if (bVar2) {
    if (((this->doProfileLoopCheck & 1U) != 0) &&
       (((byte)this->interpreterStackFrame[0xd6] >> 4 & 1) != 0)) {
      if (((byte)this->interpreterStackFrame[0xd6] >> 3 & 1) != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                    ,0x178b,"(!interpreterStackFrame->switchProfileMode)",
                                    "!interpreterStackFrame->switchProfileMode");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
      }
      this->interpreterStackFrame[0xd6] =
           (InterpreterStackFrame)((byte)this->interpreterStackFrame[0xd6] & 0xf7 | 8);
      if (*(int *)(this->interpreterStackFrame + 0xd8) != -1) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                    ,0x178d,
                                    "(interpreterStackFrame->switchProfileModeOnLoopEndNumber == 0u - 1)"
                                    ,
                                    "interpreterStackFrame->switchProfileModeOnLoopEndNumber == 0u - 1"
                                   );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
      }
      *(uint32 *)(this->interpreterStackFrame + 0xd8) = this->loopNumber;
    }
  }
  else {
    if (*(uint32 *)(this->interpreterStackFrame + 0xd8) == this->loopNumber) {
      if (((byte)this->interpreterStackFrame[0xd6] >> 3 & 1) != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                    ,0x1796,"(!interpreterStackFrame->switchProfileMode)",
                                    "!interpreterStackFrame->switchProfileMode");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
      }
      this->interpreterStackFrame[0xd6] =
           (InterpreterStackFrame)((byte)this->interpreterStackFrame[0xd6] & 0xf7 | 8);
      *(undefined4 *)(this->interpreterStackFrame + 0xd8) = 0xffffffff;
    }
    this_00 = ScriptContext::GetThreadContext
                        (*(ScriptContext **)(this->interpreterStackFrame + 0x78));
    ThreadContext::DecrementLoopDepth(this_00);
  }
  return;
}

Assistant:

~AutoRestoreLoopNumbers()
            {
                interpreterStackFrame->currentLoopNum = LoopHeader::NoLoop;
                interpreterStackFrame->currentLoopCounter = 0;
                Js::FunctionBody* fn = interpreterStackFrame->m_functionBody;
                if (fn->RecentlyBailedOutOfJittedLoopBody())
                {
                    if (doProfileLoopCheck && interpreterStackFrame->isAutoProfiling)
                    {
                        // Start profiling the loop after a bailout. Some bailouts require subsequent profile data collection such
                        // that the rejitted loop body would not bail out again for the same reason.
                        Assert(!interpreterStackFrame->switchProfileMode);
                        interpreterStackFrame->switchProfileMode = true;
                        Assert(interpreterStackFrame->switchProfileModeOnLoopEndNumber == 0u - 1);
                        interpreterStackFrame->switchProfileModeOnLoopEndNumber = loopNumber;
                    }
                }
                else
                {
                    if (interpreterStackFrame->switchProfileModeOnLoopEndNumber == loopNumber)
                    {
                        // Stop profiling since the jitted loop body would be exiting the loop
                        Assert(!interpreterStackFrame->switchProfileMode);
                        interpreterStackFrame->switchProfileMode = true;
                        interpreterStackFrame->switchProfileModeOnLoopEndNumber = 0u - 1;
                    }

                    interpreterStackFrame->scriptContext->GetThreadContext()->DecrementLoopDepth();
                }
            }